

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

error_code __thiscall
slang::DiagnosticEngine::addIgnoreMacroPaths(DiagnosticEngine *this,string_view pattern)

{
  bool bVar1;
  path *in_RDI;
  error_code eVar2;
  path p;
  error_code ec;
  path *__args;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *this_00;
  undefined1 in_stack_ffffffffffffffa7;
  _List in_stack_ffffffffffffffa8;
  _Alloc_hider in_stack_ffffffffffffffb0;
  uint local_10;
  pointer local_8;
  
  this_00 = (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             *)&stack0xfffffffffffffff0;
  std::error_code::error_code((error_code *)in_RDI);
  __args = (path *)&stack0xffffffffffffff88;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)in_stack_ffffffffffffffb0._M_p,
             (basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_ffffffffffffffa8._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl,in_stack_ffffffffffffffa7);
  std::filesystem::weakly_canonical((path *)&stack0xffffffffffffffb0,(error_code *)__args);
  std::filesystem::__cxx11::path::~path(in_RDI);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xfffffffffffffff0);
  if (!bVar1) {
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(this_00,__args);
  }
  std::filesystem::__cxx11::path::~path(in_RDI);
  eVar2._4_4_ = 0;
  eVar2._M_value = local_10;
  eVar2._M_cat = (error_category *)local_8;
  return eVar2;
}

Assistant:

std::error_code DiagnosticEngine::addIgnoreMacroPaths(std::string_view pattern) {
    std::error_code ec;
    auto p = fs::weakly_canonical(pattern, ec);
    if (!ec)
        ignoreMacroWarnPatterns.emplace_back(std::move(p));

    return ec;
}